

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O1

int AF_A_M_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  PClassActor *type;
  char *__assertion;
  AActor *pAVar7;
  bool bVar8;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0059c73a;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (self->super_DThinker).super_DObject.Class;
      bVar8 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar8) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar8) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0059c73a;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0059c70f;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0059c73a;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar7 = (self->target).field_0.p;
      if (pAVar7 != (AActor *)0x0) {
        if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          A_FaceTarget(self);
          pAVar7 = (self->target).field_0.p;
          if ((pAVar7 != (AActor *)0x0) &&
             (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (self->target).field_0.p = (AActor *)0x0;
            pAVar7 = (AActor *)0x0;
          }
          type = PClass::FindActor("PlasmaBall");
          P_SpawnMissile(self,pAVar7,type,(AActor *)0x0);
          self->special1 = level.maptime + 0x14;
        }
        else {
          (self->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0059c70f:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0059c73a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                ,0x22f,"int AF_A_M_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_M_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);
	P_SpawnMissile (self, self->target, PClass::FindActor("PlasmaBall"));
	self->special1 = level.maptime + 20;
	return 0;
}